

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
::destroy(ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
          *this)

{
  if ((this->result).value.ptr.isSet == true) {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
              (&(this->result).value.ptr.field_1.value);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }